

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

bool __thiscall mario::TimerQueue::insert(TimerQueue *this,Timer *timer)

{
  bool bVar1;
  pointer ppVar2;
  Timer **extraout_RDX;
  Timer **extraout_RDX_00;
  Timer **__y;
  pair<std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>,_bool> pVar3;
  bool local_91;
  int64_t local_80;
  pair<mario::Timer_*,_long> local_78;
  _Base_ptr local_68;
  undefined1 local_60;
  value_type local_58;
  int64_t local_48;
  Timestamp local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  Timestamp when;
  Timestamp TStack_18;
  bool earliestChanged;
  Timer *timer_local;
  TimerQueue *this_local;
  
  TStack_18._microSecondsSinceEpoch = (int64_t)timer;
  timer_local = (Timer *)this;
  EventLoop::assertInLoopThread(this->_loop);
  it._M_node = (_Base_ptr)Timer::expiration((Timer *)TStack_18._microSecondsSinceEpoch);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
       ::begin(&this->_timers);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
       ::end(&this->_timers);
  bVar1 = std::operator==(&local_30,&local_38);
  local_91 = true;
  __y = extraout_RDX;
  if (!bVar1) {
    local_40._microSecondsSinceEpoch = (int64_t)it._M_node;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>::operator->
                       (&local_30);
    local_48 = (ppVar2->first)._microSecondsSinceEpoch;
    local_91 = operator<(local_40,(Timestamp)local_48);
    __y = extraout_RDX_00;
  }
  local_58.first._microSecondsSinceEpoch =
       (int64_t)std::make_pair<mario::Timestamp&,mario::Timer*&>
                          ((pair<mario::Timestamp,_mario::Timer_*> *)&it,&stack0xffffffffffffffe8,
                           __y);
  pVar3 = std::
          set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          ::insert(&this->_timers,&local_58);
  local_68 = (_Base_ptr)pVar3.first._M_node;
  local_60 = pVar3.second;
  local_80 = Timer::sequence(TStack_18._microSecondsSinceEpoch);
  std::pair<mario::Timer_*,_long>::pair<mario::Timer_*&,_long,_true>
            (&local_78,(Timer **)&stack0xffffffffffffffe8,&local_80);
  std::
  set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::insert(&this->_activeTimers,&local_78);
  return local_91 != false;
}

Assistant:

bool TimerQueue::insert(Timer* timer) {
    _loop->assertInLoopThread();
    bool earliestChanged = false;
    Timestamp when = timer->expiration();
    auto it = _timers.begin();
    if (it == _timers.end() || when < it->first) {
        earliestChanged = true;
    }

    _timers.insert(std::make_pair(when, timer));
    _activeTimers.insert(ActiveTimer(timer, timer->sequence()));
    return earliestChanged;
}